

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

int match_list(int *acc,char **str,size_t *len,char *lst,size_t lstlen,date_parse_string *capture)

{
  int iVar1;
  int iVar2;
  size_t *in_RCX;
  long *in_RDX;
  size_t *in_RSI;
  int *in_RDI;
  char *in_R8;
  size_t *in_R9;
  bool bVar3;
  date_parse_string part;
  size_t curlen;
  char *curstr;
  size_t rem;
  char *p;
  int idx;
  int bestidx;
  int bestlen;
  date_parse_string local_78;
  date_parse_string *capture_00;
  size_t litlen;
  size_t *len_00;
  undefined4 in_stack_ffffffffffffffb8;
  int local_40;
  int local_3c;
  char *local_30;
  size_t *local_28;
  uint local_4;
  
  local_3c = 0;
  local_40 = 0;
  local_30 = in_R8;
  local_28 = in_RCX;
  while( true ) {
    bVar3 = false;
    if (local_30 != (char *)0x0) {
      iVar1 = is_space(L'\0');
      bVar3 = iVar1 != 0;
    }
    if (!bVar3) break;
    local_28 = (size_t *)((long)local_28 + 1);
    local_30 = local_30 + -1;
  }
  iVar1 = 1;
  while (len_00 = local_28, local_30 != (char *)0x0) {
    while( true ) {
      bVar3 = false;
      if (((local_30 != (char *)0x0) && (bVar3 = false, (char)*len_00 != '=')) &&
         (bVar3 = false, (char)*len_00 != ',')) {
        bVar3 = (char)*len_00 != ';';
      }
      if (!bVar3) break;
      local_30 = local_30 + -1;
      len_00 = (size_t *)((long)len_00 + 1);
    }
    litlen = *in_RSI;
    capture_00 = (date_parse_string *)*in_RDX;
    date_parse_string::date_parse_string(&local_78);
    if (((len_00 != local_28) &&
        (iVar2 = match_lit((char **)CONCAT44(iVar1,in_stack_ffffffffffffffb8),len_00,local_30,litlen
                           ,capture_00), iVar2 != 0)) && ((long)local_3c < (long)(litlen - *in_RSI))
       ) {
      local_3c = (int)litlen - (int)*in_RSI;
      local_40 = iVar1;
    }
    if ((local_30 == (char *)0x0) || ((char)*len_00 == ';')) break;
    local_28 = len_00;
    if ((char)*len_00 == ',') {
      iVar1 = iVar1 + 1;
      do {
        local_28 = (size_t *)((long)local_28 + 1);
        local_30 = local_30 + -1;
        bVar3 = false;
        if (local_30 != (char *)0x0) {
          iVar2 = is_space(L'\0');
          bVar3 = iVar2 != 0;
        }
      } while (bVar3);
    }
    else if ((char)*len_00 == '=') {
      local_28 = (size_t *)((long)len_00 + 1);
      local_30 = local_30 + -1;
    }
  }
  if (local_3c != 0) {
    *in_R9 = *in_RSI;
    in_R9[1] = (long)local_3c;
    *in_RDI = local_40;
    *in_RSI = *in_RSI + (long)local_3c;
    *in_RDX = *in_RDX - (long)local_3c;
  }
  local_4 = (uint)(local_3c != 0);
  return local_4;
}

Assistant:

static int match_list(int &acc, const char *&str, size_t &len,
                      const char *lst, size_t lstlen,
                      date_parse_string &capture)
{
    /* no matches yet */
    int bestlen = 0;
    int bestidx = 0;

    /* skip leading spaces */
    for ( ; lstlen != 0 && is_space(*lst) ; ++lst, --lstlen) ;
    
    /* keep going until we're out of list */
    for (int idx = 1 ; lstlen != 0 ; )
    {
        /* find the next delimiter */
        const char *p = lst;
        size_t rem = lstlen;
        for ( ; rem != 0 && *p != '=' && *p != ',' && *p != ';' ; ++p, --rem) ;

        /* try matching this text */
        const char *curstr = str;
        size_t curlen = len;
        date_parse_string part;
        if (p - lst != 0 && match_lit(curstr, curlen, lst, p - lst, part))
        {
            /* if this is the best one so far, remember it */
            if (curstr - str > bestlen)
            {
                bestlen = curstr - str;
                bestidx = idx;
            }
        }

        /* 
         *   If we're at an '=', an alias for this same item follows, so keep
         *   going without upping the index.  If we're at a comma, we're on
         *   to the next item.  If we're at a ';' or the end of the string,
         *   it's the end of the list, so we've failed to find a match.
         */
        if (rem == 0 || *p == ';')
        {
            /* end of the list */
            break;
        }
        else if (*p == ',')
        {
            /* next list item follows - up the index */
            ++idx;

            /* skip the comma and any spaces before the next item */
            for (++p, --rem ; rem != 0 && is_space(*p) ; ++p, --rem) ;
        }
        else if (*p == '=')
        {
            /* alias - just skip the '=' */
            ++p, --rem;
        }

        /* on to the next item */
        lst = p;
        lstlen = rem;
    }

    /* if we found a match, return it */
    if (bestlen != 0)
    {
        capture.p = str;
        capture.len = bestlen;
        acc = bestidx;
        str += bestlen;
        len -= bestlen;
        return TRUE;
    }
    else
        return FALSE;
}